

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O3

void olsrv2_tc_endpoint_remove(olsrv2_tc_attachment *net)

{
  oonf_class_event(&_tc_attached_class,net,OONF_OBJECT_REMOVED);
  avl_remove(&net->src->_attached_networks,&net->_src_node);
  avl_remove(&net->dst->_attached_networks,&net->_endpoint_node);
  if ((net->dst->_attached_networks).count == 0) {
    oonf_class_event(&_tc_endpoint_class,net->dst,OONF_OBJECT_REMOVED);
    avl_remove(&_tc_endpoint_tree,&net->dst->_node);
    oonf_class_free(&_tc_endpoint_class,net->dst);
  }
  oonf_class_free(&_tc_attached_class,net);
  olsrv2_routing_domain_changed((nhdp_domain *)0x0,true);
  return;
}

Assistant:

void
olsrv2_tc_endpoint_remove(struct olsrv2_tc_attachment *net) {
  oonf_class_event(&_tc_attached_class, net, OONF_OBJECT_REMOVED);

  /* remove from node */
  avl_remove(&net->src->_attached_networks, &net->_src_node);

  /* remove from endpoint */
  avl_remove(&net->dst->_attached_networks, &net->_endpoint_node);

  if (net->dst->_attached_networks.count == 0) {
    oonf_class_event(&_tc_endpoint_class, net->dst, OONF_OBJECT_REMOVED);

    /* remove endpoint */
    avl_remove(&_tc_endpoint_tree, &net->dst->_node);
    oonf_class_free(&_tc_endpoint_class, net->dst);
  }

  /* free attached network */
  oonf_class_free(&_tc_attached_class, net);

  /* all domains might have changed */
  olsrv2_routing_domain_changed(NULL, true);
}